

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

ztlex_t * ztlex_from_string(ztlex_mallocfn_t *mallocfn,ztlex_freefn_t *freefn,char *string)

{
  size_t sVar1;
  char *in_RDX;
  ztlex_freefn_t *in_RSI;
  code *in_RDI;
  ztlex_t *lex;
  ztlex_t *local_8;
  
  local_8 = (ztlex_t *)(*in_RDI)(0x360);
  if (local_8 == (ztlex_t *)0x0) {
    local_8 = (ztlex_t *)0x0;
  }
  else {
    local_8->file = (FILE *)0x0;
    local_8->ungottenptr = (char *)0x0;
    local_8->string = in_RDX;
    sVar1 = strlen(in_RDX);
    local_8->length = sVar1;
    local_8->index = 0;
    local_8->line = 1;
    local_8->column = 1;
    local_8->prevcolumn = -1;
    local_8->getC = ztlex_sgetc;
    local_8->ungetC = ztlex_sungetc;
    local_8->freefn = in_RSI;
  }
  return local_8;
}

Assistant:

ztlex_t *ztlex_from_string(ztlex_mallocfn_t *mallocfn,
                           ztlex_freefn_t   *freefn,
                           const char       *string)
{
  ztlex_t *lex = NULL;

  lex = mallocfn(sizeof(*lex));
  if (lex == NULL)
    return NULL;

  lex->file        = NULL;
  lex->ungottenptr = NULL;

  lex->string      = string; /* FIXME: Copy string */
  lex->length      = strlen(string);
  lex->index       = 0;

  lex->line        = 1;
  lex->column      = 1;
  lex->prevcolumn  = -1;

  lex->getC        = ztlex_sgetc;
  lex->ungetC      = ztlex_sungetc;

  lex->freefn      = freefn;

  return lex;
}